

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

uint32_t __thiscall fasttext::Dictionary::hash(Dictionary *this,string *str)

{
  char *pcVar1;
  uint uVar2;
  size_type sVar3;
  
  if (str->_M_string_length != 0) {
    uVar2 = 0x811c9dc5;
    sVar3 = 0;
    do {
      pcVar1 = (str->_M_dataplus)._M_p + sVar3;
      sVar3 = sVar3 + 1;
      uVar2 = ((int)*pcVar1 ^ uVar2) * 0x1000193;
    } while (str->_M_string_length != sVar3);
    return uVar2;
  }
  return 0x811c9dc5;
}

Assistant:

uint32_t Dictionary::hash(const std::string& str) const {
	uint32_t h = 2166136261;
	for (size_t i = 0; i < str.size(); i++) {
		h = h ^ uint32_t(int8_t(str[i]));
		h = h * 16777619;
	}
	return h;
}